

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint32_t farmhashsu::Hash32WithSeed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = (uint)len;
  if (len < 0x19) {
    if (len < 0xd) {
      if (len < 5) {
        uVar3 = 9;
        if (len != 0) {
          sVar2 = 0;
          do {
            seed = seed * -0x3361d2af + (int)s[sVar2];
            uVar3 = uVar3 ^ seed;
            sVar2 = sVar2 + 1;
          } while (len != sVar2);
        }
        uVar3 = (uVar6 * 0x16a88000 | uVar6 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar3;
        uVar6 = (seed * 0x16a88000 | seed * -0x3361d2af >> 0x11) * 0x1b873593 ^
                (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
        uVar6 = (uVar6 >> 0x13 | uVar6 << 0xd) * 5 + 0xe6546b64;
      }
      else {
        iVar4 = uVar6 * 5 + *(int *)(s + (len - 4));
        uVar3 = ((*(int *)s + uVar6) * 0x16a88000 | (*(int *)s + uVar6) * -0x3361d2af >> 0x11) *
                0x1b873593 ^ uVar6 * 5 + seed;
        uVar3 = (iVar4 * 0x16a88000 | (uint)(iVar4 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
                (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
        uVar6 = ((*(int *)(s + (ulong)(uVar6 >> 3 & 1) * 4) + 9) * 0x16a88000 |
                (uint)((*(int *)(s + (ulong)(uVar6 >> 3 & 1) * 4) + 9) * -0x3361d2af) >> 0x11) *
                0x1b873593 ^ (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
        uVar6 = (uVar6 >> 0x13 | uVar6 << 0xd) * 5 + 0xe6546b64 ^ seed;
      }
      uVar6 = uVar6 >> 0x10 ^ uVar6;
    }
    else {
      iVar4 = *(int *)(s + (len - 8));
      uVar3 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
              *(int *)(s + (len - 4));
      uVar6 = (iVar4 * 0x16a88000 | (uint)(iVar4 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar6 + seed * -0x3361d2af + *(int *)(s + (len >> 1)) * -0x3361d2af;
      iVar4 = (uVar3 >> 3 | uVar3 * 0x20000000) + iVar4;
      uVar3 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar6 >> 0x13 | uVar6 << 0xd) * 5 + uVar3 + 0xe6546b64;
      uVar5 = iVar4 + *(int *)(s + (len - 4));
      uVar6 = seed * -0x3361d2af ^ *(uint *)(s + 4);
      uVar6 = (uVar6 * 0x16a88000 | uVar6 * -0x3361d2af >> 0x11) * 0x1b873593 ^
              (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + iVar4 + 0xe6546b64;
      uVar6 = (uVar5 >> 0xc | uVar5 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
              (uVar6 >> 0x13 | uVar6 << 0xd) * 5;
      uVar6 = uVar6 >> 0x10 ^ uVar6;
    }
    uVar6 = (uVar6 * -0x7a143595 >> 0xd ^ uVar6 * -0x7a143595) * -0x3d4d51cb;
    uVar6 = uVar6 >> 0x10 ^ uVar6;
  }
  else {
    iVar4 = *(int *)(s + 0x10);
    uVar5 = (*(uint *)(s + 8) >> 0xc | *(uint *)(s + 8) << 0x14) + *(int *)(s + 0x14);
    uVar3 = (iVar4 * 0x16a88000 | (uint)(iVar4 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar6 ^ seed) + 0x18 + *(int *)(s + 0xc) * -0x3361d2af;
    uVar3 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + uVar5 + 0xe6546b64;
    iVar4 = (uVar5 >> 3 | uVar5 * 0x20000000) + iVar4;
    uVar5 = iVar4 + *(int *)(s + 0x14);
    uVar6 = uVar6 ^ seed ^ *(uint *)(s + 4);
    uVar6 = (uVar6 * 0x16a88000 | uVar6 * -0x3361d2af >> 0x11) * 0x1b873593 ^
            (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + iVar4 + 0xe6546b64;
    uVar6 = (uVar5 >> 0xc | uVar5 * 0x100000) + *(int *)(s + 0xc) + -0x19ab949c +
            (uVar6 >> 0x13 | uVar6 << 0xd) * 5;
    uVar6 = (uVar6 >> 0x10 ^ uVar6) * -0x7a143595;
    uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
    uVar1 = Hash32(s + 0x18,len - 0x18);
    uVar6 = crc32(uVar1 + seed,uVar6 >> 0x10 ^ uVar6);
  }
  return uVar6;
}

Assistant:

uint32_t Hash32WithSeed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhashmk::Hash32Len13to24(s, len, seed * c1);
    else if (len >= 5) return farmhashmk::Hash32Len5to12(s, len, seed);
    else return farmhashmk::Hash32Len0to4(s, len, seed);
  }
  uint32_t h = farmhashmk::Hash32Len13to24(s, 24, seed ^ len);
  return _mm_crc32_u32(Hash32(s + 24, len - 24) + seed, h);
}